

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

Offset<const_MyGame::Example::Vec3_*> __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateStruct<MyGame::Example::Vec3>
          (FlatBufferBuilderImpl<false> *this,Vec3 *structobj)

{
  type _o;
  size_t elem_size;
  Vec3 *structobj_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  NotNested(this);
  elem_size = AlignOf<MyGame::Example::Vec3>();
  Align(this,elem_size);
  vector_downward<unsigned_int>::push_small<MyGame::Example::Vec3>(&this->buf_,structobj);
  _o = CalculateOffset<unsigned_int>(this);
  Offset<const_MyGame::Example::Vec3_*>::Offset
            ((Offset<const_MyGame::Example::Vec3_*> *)((long)&this_local + 4),_o);
  return (Offset<const_MyGame::Example::Vec3_*>)this_local._4_4_;
}

Assistant:

Offset<const T *> CreateStruct(const T &structobj) {
    NotNested();
    Align(AlignOf<T>());
    buf_.push_small(structobj);
    return Offset<const T *>(
        CalculateOffset<typename Offset<const T *>::offset_type>());
  }